

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena.cc
# Opt level: O1

AllocatedBlock * __thiscall ctemplate::BaseArena::IndexToBlock(BaseArena *this,int index)

{
  ulong uVar1;
  vector<ctemplate::BaseArena::AllocatedBlock,_std::allocator<ctemplate::BaseArena::AllocatedBlock>_>
  *pvVar2;
  pointer pAVar3;
  ulong uVar4;
  AllocatedBlock *pAVar5;
  uint extraout_EDX;
  ulong uVar6;
  size_t sVar7;
  uint uVar8;
  undefined4 in_register_00000034;
  ulong block_size;
  
  block_size = CONCAT44(in_register_00000034,index);
  if ((uint)index < 0x10) {
    return this->first_blocks_ + (uint)index;
  }
  pvVar2 = this->overflow_blocks_;
  if (pvVar2 == (vector<ctemplate::BaseArena::AllocatedBlock,_std::allocator<ctemplate::BaseArena::AllocatedBlock>_>
                 *)0x0) {
    IndexToBlock();
  }
  else {
    uVar8 = index - 0x10;
    block_size = (ulong)uVar8;
    if (-1 < (int)uVar8) {
      pAVar3 = (pvVar2->
               super__Vector_base<ctemplate::BaseArena::AllocatedBlock,_std::allocator<ctemplate::BaseArena::AllocatedBlock>_>
               )._M_impl.super__Vector_impl_data._M_start;
      if ((ulong)uVar8 <
          (ulong)((long)(pvVar2->
                        super__Vector_base<ctemplate::BaseArena::AllocatedBlock,_std::allocator<ctemplate::BaseArena::AllocatedBlock>_>
                        )._M_impl.super__Vector_impl_data._M_finish - (long)pAVar3 >> 4)) {
        return pAVar3 + uVar8;
      }
      goto LAB_0012f42a;
    }
  }
  IndexToBlock();
LAB_0012f42a:
  IndexToBlock();
  if (block_size == 0) {
    return (AllocatedBlock *)0x0;
  }
  if (0 < (int)extraout_EDX) {
    uVar4 = (ulong)(int)extraout_EDX;
    uVar1 = uVar4 - 1;
    if ((uVar4 & uVar1) == 0) {
      if (this->block_size_ >> 2 < block_size) {
        if (extraout_EDX < 9) {
          pAVar5 = AllocNewBlock(this,block_size);
          return (AllocatedBlock *)pAVar5->mem;
        }
        __assert_fail("align <= kDefaultAlignment",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/rockdreamer[P]ctemplate/src/base/arena.cc"
                      ,0x116,
                      "void *ctemplate::BaseArena::GetMemoryFallback(const size_t, const int)");
      }
      uVar6 = uVar1 & (ulong)this->freestart_;
      if (uVar6 != 0) {
        uVar4 = uVar4 - uVar6;
        this->freestart_ = this->freestart_ + uVar4;
        sVar7 = 0;
        if (uVar4 <= this->remaining_) {
          sVar7 = this->remaining_ - uVar4;
        }
        this->remaining_ = sVar7;
      }
      if (this->remaining_ < block_size) {
        pAVar5 = AllocNewBlock(this,this->block_size_);
        this->freestart_ = pAVar5->mem;
        this->remaining_ = pAVar5->size;
      }
      this->remaining_ = this->remaining_ - block_size;
      pAVar5 = (AllocatedBlock *)this->freestart_;
      this->last_alloc_ = (char *)pAVar5;
      this->freestart_ = (char *)((long)&pAVar5->mem + block_size);
      if ((uVar1 & (ulong)pAVar5) == 0) {
        return pAVar5;
      }
      __assert_fail("0 == (reinterpret_cast<uintptr_t>(last_alloc_) & (align-1))",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/rockdreamer[P]ctemplate/src/base/arena.cc"
                    ,0x12d,"void *ctemplate::BaseArena::GetMemoryFallback(const size_t, const int)")
      ;
    }
  }
  __assert_fail("align_as_int > 0 && 0 == (align & (align - 1))",
                "/workspace/llm4binary/github/license_all_cmakelists_25/rockdreamer[P]ctemplate/src/base/arena.cc"
                ,0x110,"void *ctemplate::BaseArena::GetMemoryFallback(const size_t, const int)");
}

Assistant:

const BaseArena::AllocatedBlock *BaseArena::IndexToBlock(int index) const {
  if (index < ARRAYSIZE(first_blocks_)) {
    return &first_blocks_[index];
  }
  CHECK(overflow_blocks_ != NULL);
  int index_in_overflow_blocks = index - ARRAYSIZE(first_blocks_);
  CHECK_GE(index_in_overflow_blocks, 0);
  CHECK_LT(static_cast<size_t>(index_in_overflow_blocks),
           overflow_blocks_->size());
  return &(*overflow_blocks_)[index_in_overflow_blocks];
}